

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  uint uVar4;
  IStreamingReporter *pIVar5;
  RunContext *this_00;
  RunContext *this_01;
  AssertionInfo *in_RDI;
  SectionStats testCaseSectionStats;
  bool missingAssertions;
  Counts assertions;
  TestFailureException *anon_var_0;
  StreamRedirect cerrRedir;
  StreamRedirect coutRedir;
  Timer timer;
  double duration;
  Counts prevAssertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  AssertionInfo *in_stack_fffffffffffff798;
  AssertionInfo *in_stack_fffffffffffff7a0;
  SectionInfo *this_02;
  undefined6 in_stack_fffffffffffff7a8;
  undefined1 in_stack_fffffffffffff7ae;
  string *in_stack_fffffffffffff7b8;
  SectionInfo *_sectionInfo;
  string *in_stack_fffffffffffff7c0;
  Flags _resultDisposition;
  SourceLineInfo *in_stack_fffffffffffff7c8;
  ostream *_capturedExpression;
  SectionInfo *in_stack_fffffffffffff7d0;
  StreamRedirect *this_03;
  allocator *_macroName;
  undefined1 local_810 [159];
  undefined1 local_771;
  unsigned_long uStack_768;
  unsigned_long local_760 [186];
  undefined1 local_189;
  Timer local_188;
  undefined1 local_179 [40];
  allocator local_151;
  string local_150 [32];
  SectionInfo local_130;
  SectionInfo *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  size_t local_a8;
  undefined1 local_88 [104];
  TestCaseInfo *local_20;
  
  local_20 = TestCase::getTestCaseInfo(*(TestCase **)&(in_RDI->lineInfo).field_0x18);
  SectionInfo::SectionInfo
            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
             in_stack_fffffffffffff7b8);
  _resultDisposition = (Flags)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
  pIVar5 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)&in_RDI[2].field_0x60);
  (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar5,local_88);
  local_a8 = in_RDI[2].lineInfo.line;
  local_b8 = *(undefined8 *)&in_RDI[2].lineInfo.field_0x10;
  uStack_b0 = *(undefined8 *)&in_RDI[2].lineInfo.field_0x18;
  local_c0 = (SectionInfo *)0x0;
  _macroName = &local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"TEST_CASE",_macroName);
  _capturedExpression = (ostream *)&local_20->lineInfo;
  this_03 = (StreamRedirect *)local_179;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_179 + 1),"",(allocator *)this_03);
  AssertionInfo::AssertionInfo
            (in_RDI,(string *)_macroName,(SourceLineInfo *)this_03,(string *)_capturedExpression,
             _resultDisposition);
  _sectionInfo = &local_130;
  AssertionInfo::operator=(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  AssertionInfo::~AssertionInfo(in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string((string *)(local_179 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  this_00 = (RunContext *)
            Ptr<const_Catch::IConfig>::operator*
                      ((Ptr<const_Catch::IConfig> *)&in_RDI[2].lineInfo.field_0x8);
  seedRng((IConfig *)0x1c1bf7);
  Timer::Timer(&local_188);
  Timer::start((Timer *)in_stack_fffffffffffff7a0);
  this_01 = (RunContext *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)&in_RDI[2].field_0x60);
  uVar4 = (*((NonCopyable *)&(this_01->super_IResultCapture)._vptr_IResultCapture)->
            _vptr_NonCopyable[4])();
  uVar1 = (undefined1)uVar4;
  local_189 = uVar1;
  if ((uVar4 & 1) == 0) {
    invokeActiveTestCase(this_01);
  }
  else {
    cout();
    StreamRedirect::StreamRedirect(this_03,_capturedExpression,(string *)this_00);
    cerr();
    StreamRedirect::StreamRedirect(this_03,_capturedExpression,(string *)this_00);
    invokeActiveTestCase(this_01);
    StreamRedirect::~StreamRedirect(this_03);
    StreamRedirect::~StreamRedirect(this_03);
  }
  this_02 = (SectionInfo *)Timer::getElapsedSeconds((Timer *)0x1c1f2e);
  local_c0 = this_02;
  (**(code **)(*(long *)(in_RDI->lineInfo).line + 0x50))();
  handleUnfinishedSections(this_00);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x1c1e11);
  Counts::operator-((Counts *)this_01,
                    (Counts *)
                    CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff7ae,in_stack_fffffffffffff7a8)));
  uVar2 = testForMissingAssertions
                    ((RunContext *)
                     CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff7ae,in_stack_fffffffffffff7a8)),
                     (Counts *)this_02);
  local_771 = uVar2;
  bVar3 = TestCaseInfo::okToFail(local_20);
  if (bVar3) {
    std::swap<unsigned_long>(local_760,&uStack_768);
    *(unsigned_long *)&in_RDI[2].lineInfo.field_0x18 =
         *(long *)&in_RDI[2].lineInfo.field_0x18 - local_760[0];
    in_RDI[2].lineInfo.line = local_760[0] + in_RDI[2].lineInfo.line;
  }
  SectionStats::SectionStats
            ((SectionStats *)this_00,_sectionInfo,(Counts *)this_01,
             (double)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffff7a8)),
             SUB81((ulong)this_02 >> 0x38,0));
  pIVar5 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)&in_RDI[2].field_0x60);
  (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar5,local_810);
  SectionStats::~SectionStats((SectionStats *)0x1c1ff2);
  SectionInfo::~SectionInfo(this_02);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );

                seedRng( *m_config );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( Catch::cout(), redirectedCout );
                    StreamRedirect cerrRedir( Catch::cerr(), redirectedCerr );
                    invokeActiveTestCase();
                }
                else {
                    invokeActiveTestCase();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                makeUnexpectedResultBuilder().useActiveException();
            }
            m_testCaseTracker->close();
            handleUnfinishedSections();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }